

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::FocusWindow(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  value_type *ppIVar2;
  iterator ppIVar3;
  int local_1c;
  int i;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  
  pIVar1 = GImGui;
  GImGui->FocusedWindow = window;
  if (window != (ImGuiWindow *)0x0) {
    g = (ImGuiContext *)window;
    if (window->RootWindow != (ImGuiWindow *)0x0) {
      g = (ImGuiContext *)window->RootWindow;
    }
    if ((((((uint)(g->IO).DisplaySize.y & 0x2000000) != 0) && (pIVar1->ActiveId != 0)) &&
        (pIVar1->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
       ((ImGuiContext *)pIVar1->ActiveIdWindow->RootWindow != g)) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
    if ((((uint)(g->IO).DisplaySize.y & 0x2000) == 0) &&
       (ppIVar2 = ImVector<ImGuiWindow_*>::back(&pIVar1->Windows), (ImGuiContext *)*ppIVar2 != g)) {
      for (local_1c = 0; local_1c < (pIVar1->Windows).Size; local_1c = local_1c + 1) {
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,local_1c);
        if ((ImGuiContext *)*ppIVar2 == g) {
          ppIVar3 = ImVector<ImGuiWindow_*>::begin(&pIVar1->Windows);
          ImVector<ImGuiWindow_*>::erase(&pIVar1->Windows,ppIVar3 + local_1c);
          break;
        }
      }
      ImVector<ImGuiWindow_*>::push_back(&pIVar1->Windows,(value_type *)&g);
    }
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    // Always mark the window we passed as focused. This is used for keyboard interactions such as tabbing.
    g.FocusedWindow = window;

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;

    // And move its root window to the top of the pile
    if (window->RootWindow)
        window = window->RootWindow;

    // Steal focus on active widgets
    if (window->Flags & ImGuiWindowFlags_Popup) // FIXME: This statement should be unnecessary. Need further testing before removing it..
        if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != window)
            SetActiveID(0);

    // Bring to front
    if ((window->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus) || g.Windows.back() == window)
        return;
    for (int i = 0; i < g.Windows.Size; i++)
        if (g.Windows[i] == window)
        {
            g.Windows.erase(g.Windows.begin() + i);
            break;
        }
    g.Windows.push_back(window);
}